

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GEN_Register.cpp
# Opt level: O0

uint8_t __thiscall GEN_Register::getReg_8(GEN_Register *this,string *flagName)

{
  code *pcVar1;
  bool bVar2;
  unsigned_long uVar3;
  string *flagName_local;
  GEN_Register *this_local;
  
  bVar2 = std::operator==(flagName,"AH");
  if (bVar2) {
    uVar3 = std::bitset<8UL>::to_ulong(&AH);
    this_local._7_1_ = (uint8_t)uVar3;
  }
  else {
    bVar2 = std::operator==(flagName,"AL");
    if (bVar2) {
      uVar3 = std::bitset<8UL>::to_ulong(&AL);
      this_local._7_1_ = (uint8_t)uVar3;
    }
    else {
      bVar2 = std::operator==(flagName,"DH");
      if (bVar2) {
        uVar3 = std::bitset<8UL>::to_ulong(&DH);
        this_local._7_1_ = (uint8_t)uVar3;
      }
      else {
        bVar2 = std::operator==(flagName,"DL");
        if (bVar2) {
          uVar3 = std::bitset<8UL>::to_ulong(&DL);
          this_local._7_1_ = (uint8_t)uVar3;
        }
        else {
          bVar2 = std::operator==(flagName,"CH");
          if (bVar2) {
            uVar3 = std::bitset<8UL>::to_ulong(&CH);
            this_local._7_1_ = (uint8_t)uVar3;
          }
          else {
            bVar2 = std::operator==(flagName,"CL");
            if (bVar2) {
              uVar3 = std::bitset<8UL>::to_ulong(&CL);
              this_local._7_1_ = (uint8_t)uVar3;
            }
            else {
              bVar2 = std::operator==(flagName,"BH");
              if (bVar2) {
                uVar3 = std::bitset<8UL>::to_ulong(&BH);
                this_local._7_1_ = (uint8_t)uVar3;
              }
              else {
                bVar2 = std::operator==(flagName,"BL");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                uVar3 = std::bitset<8UL>::to_ulong(&BL);
                this_local._7_1_ = (uint8_t)uVar3;
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

uint8_t GEN_Register::getReg_8(std::string flagName)
{
	if (flagName == "AH")
	{
		return (uint8_t)(AH.to_ulong());
	}
	else if (flagName == "AL")
	{
		return (uint8_t)(AL.to_ulong());
	}
    else if (flagName == "DH")
    {
        return (uint8_t)(DH.to_ulong());
    }
    else if (flagName == "DL")
    {
        return (uint8_t)(DL.to_ulong());
    }
    else if (flagName == "CH")
    {
        return (uint8_t)(CH.to_ulong());
    }
    else if (flagName == "CL")
    {
        return (uint8_t)(CL.to_ulong());
    }
    else if (flagName == "BH")
    {
        return (uint8_t)(BH.to_ulong());
    }
    else if (flagName == "BL")
    {
        return (uint8_t)(BL.to_ulong());
    }
}